

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointOnCurveProjection.h
# Opt level: O1

void __thiscall
anurbs::PointOnCurveProjection<3L>::compute
          (PointOnCurveProjection<3L> *this,Vector *sample,double max_distance)

{
  double *pdVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  pointer pMVar4;
  double dVar5;
  pointer pdVar6;
  long lVar7;
  long lVar8;
  bool bVar9;
  ulong uVar10;
  undefined4 extraout_XMM0_Da;
  undefined4 uVar11;
  undefined4 extraout_XMM0_Db;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined8 in_XMM1_Qa;
  double dVar15;
  double dVar16;
  undefined8 in_XMM1_Qb;
  double dVar17;
  double dVar18;
  undefined1 auVar19 [16];
  double dVar20;
  double dVar21;
  double dVar22;
  undefined1 in_XMM4 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  Vector point_at_t0;
  Vector point_at_t1;
  value_type t1;
  value_type t0;
  value_type point1;
  double local_148;
  double *local_138;
  ParameterPoint local_128;
  double local_100;
  double local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined4 local_d8;
  undefined4 uStack_d4;
  undefined8 uStack_d0;
  double local_c8;
  double dStack_c0;
  Vector local_b8;
  double local_98;
  double local_90;
  undefined1 local_88 [16];
  double local_78;
  undefined8 uStack_70;
  Vector local_68;
  Vector local_48;
  
  peVar2 = (this->m_curve).super___shared_ptr<anurbs::CurveBase<3L>,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var3 = (this->m_curve).super___shared_ptr<anurbs::CurveBase<3L>,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
  }
  (*peVar2->_vptr_CurveBase[3])();
  local_100 = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
  local_d8 = (undefined4)in_XMM1_Qa;
  uStack_d4 = (undefined4)((ulong)in_XMM1_Qa >> 0x20);
  uStack_d0 = in_XMM1_Qb;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  local_138 = (double *)0x0;
  if (max_distance <= 0.0) {
    pdVar6 = (this->m_tessellation).first.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (8 < (long)(this->m_tessellation).first.super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)pdVar6) {
      lVar7 = 1;
      local_148 = INFINITY;
      local_138 = (double *)0x0;
      lVar8 = 0;
      do {
        local_90 = pdVar6[lVar7 + 0xffffffffffffffff];
        pMVar4 = (this->m_tessellation).second.
                 super__Vector_base<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_b8.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
        [2] = *(double *)
               ((long)(pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).
                      m_storage.m_data.array + lVar8 + 0x10);
        pdVar1 = (double *)
                 ((long)(pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).
                        m_storage.m_data.array + lVar8);
        local_b8.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
        [0] = *pdVar1;
        local_b8.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
        [1] = pdVar1[1];
        local_98 = pdVar6[lVar7];
        local_68.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
        [2] = *(double *)
               ((long)pMVar4[1].super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                      m_storage.m_data.array + lVar8 + 0x10);
        pdVar1 = (double *)
                 ((long)pMVar4[1].super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                        m_storage.m_data.array + lVar8);
        local_68.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
        [0] = *pdVar1;
        local_68.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
        [1] = pdVar1[1];
        project_to_line(&local_128,sample,&local_b8,&local_68,&local_90,&local_98);
        dVar18 = local_128.second.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                 m_storage.m_data.array[0] -
                 (sample->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.
                 m_data.array[0];
        dVar21 = local_128.second.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                 m_storage.m_data.array[1] -
                 (sample->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.
                 m_data.array[1];
        dVar15 = local_128.second.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                 m_storage.m_data.array[2] -
                 (sample->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.
                 m_data.array[2];
        dVar21 = dVar21 * dVar21;
        in_XMM4._0_8_ = dVar21 + dVar18 * dVar18;
        in_XMM4._8_8_ = dVar21;
        dVar15 = dVar15 * dVar15 + in_XMM4._0_8_;
        if (dVar15 < local_148) {
          local_138 = (double *)local_128.first;
          local_78 = local_128.second.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                     m_storage.m_data.array[2];
          uStack_70 = 0;
          local_88._8_8_ =
               local_128.second.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
               m_storage.m_data.array[1];
          local_88._0_8_ =
               local_128.second.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
               m_storage.m_data.array[0];
          local_148 = dVar15;
        }
        lVar7 = lVar7 + 1;
        pdVar6 = (this->m_tessellation).first.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        lVar8 = lVar8 + 0x18;
      } while (lVar7 < (long)(this->m_tessellation).first.
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_finish - (long)pdVar6 >> 3);
    }
  }
  else {
    local_48.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[2]
         = (sample->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
           array[2];
    local_48.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[0]
         = (sample->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
           array[0];
    local_48.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[1]
         = (sample->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
           array[1];
    PolylineMapper<3L>::map
              ((tuple<double,_long,_double,_long> *)&local_128,
               (this->mapper)._M_t.
               super___uniq_ptr_impl<anurbs::PolylineMapper<3L>,_std::default_delete<anurbs::PolylineMapper<3L>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_anurbs::PolylineMapper<3L>_*,_std::default_delete<anurbs::PolylineMapper<3L>_>_>
               .super__Head_base<0UL,_anurbs::PolylineMapper<3L>_*,_false>._M_head_impl,&local_48,
               max_distance);
    pdVar6 = (this->m_tessellation).first.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pMVar4 = (this->m_tessellation).second.
             super__Vector_base<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_138 = (double *)
                (pdVar6[(long)local_128.second.
                              super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage
                              .m_data.array[1]] *
                 local_128.second.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                 m_storage.m_data.array[2] +
                pdVar6[(long)local_128.first] *
                local_128.second.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                m_storage.m_data.array[0]);
    in_XMM4._0_8_ =
         pMVar4[(long)local_128.first].super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
         m_storage.m_data.array[0] *
         local_128.second.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
         m_data.array[0] +
         pMVar4[(long)local_128.second.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                      m_storage.m_data.array[1]].
         super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[0] *
         local_128.second.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
         m_data.array[2];
    in_XMM4._8_8_ =
         pMVar4[(long)local_128.first].super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
         m_storage.m_data.array[1] *
         local_128.second.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
         m_data.array[0] +
         pMVar4[(long)local_128.second.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                      m_storage.m_data.array[1]].
         super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[1] *
         local_128.second.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
         m_data.array[2];
    local_78 = local_128.second.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
               m_storage.m_data.array[0] *
               pMVar4[(long)local_128.first].
               super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
               [2] + local_128.second.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                     m_storage.m_data.array[2] *
                     pMVar4[(long)local_128.second.
                                  super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                                  m_storage.m_data.array[1]].
                     super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
                     array[2];
    uStack_70 = 0;
    local_88 = in_XMM4;
  }
  dVar15 = this->m_tolerance;
  local_e8 = (double *)(dVar15 * 5.0);
  uStack_e0 = 0.0;
  dVar18 = (double)CONCAT44(uStack_d4,local_d8);
  local_f8 = dVar18;
  if (local_100 <= dVar18) {
    local_f8 = local_100;
  }
  uStack_f0 = uStack_d0;
  uVar11 = local_d8;
  uVar12 = uStack_d4;
  if (dVar18 <= local_100) {
    uVar11 = SUB84(local_100,0);
    uVar12 = (undefined4)((ulong)local_100 >> 0x20);
  }
  local_c8 = (double)CONCAT44(uVar12,uVar11);
  lVar7 = 4;
  do {
    peVar2 = (this->m_curve).super___shared_ptr<anurbs::CurveBase<3L>,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    p_Var3 = (this->m_curve).super___shared_ptr<anurbs::CurveBase<3L>,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      }
    }
    (*peVar2->_vptr_CurveBase[6])(local_138._0_4_,&local_128,peVar2,2);
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    dVar21 = *(double *)local_128.first -
             (sample->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data
             .array[0];
    dVar22 = *(double *)((long)local_128.first + 8) -
             (sample->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data
             .array[1];
    dVar16 = *(double *)((long)local_128.first + 0x10) -
             (sample->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data
             .array[2];
    auVar19._0_8_ = dVar16 * dVar16 + dVar22 * dVar22 + dVar21 * dVar21;
    auVar19._8_8_ = 0;
    auVar23 = sqrtpd(in_XMM4,auVar19);
    dVar20 = *(double *)((long)local_128.first + 0x18);
    dVar5 = *(double *)((long)local_128.first + 0x20);
    dVar18 = *(double *)((long)local_128.first + 0x28);
    dVar17 = dVar16 * dVar18 + dVar22 * dVar5 + dVar21 * dVar20;
    dVar20 = dVar18 * dVar18 + dVar5 * dVar5 + dVar20 * dVar20;
    dVar18 = SQRT(dVar20) * auVar23._0_8_;
    auVar24._8_8_ = -(ulong)(auVar23._8_8_ < 0.0);
    auVar24._0_8_ = -(ulong)(auVar23._0_8_ < dVar15);
    auVar23._8_4_ = (int)-(ulong)(0.0 < uStack_e0);
    auVar23._0_8_ =
         -(ulong)((double)(-(ulong)(dVar18 != 0.0) & (ulong)ABS(dVar17 / dVar18)) < (double)local_e8
                 );
    auVar23._12_4_ = (int)(-(ulong)(0.0 < uStack_e0) >> 0x20);
    auVar24 = auVar24 | auVar23;
    in_XMM4 = auVar24;
    if ((auVar24 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      in_XMM4._0_8_ =
           dVar22 * *(double *)((long)local_128.first + 0x38) +
           dVar21 * *(double *)((long)local_128.first + 0x30);
      in_XMM4._8_8_ = dVar22 * *(double *)((long)local_128.first + 0x38);
      dVar21 = (double)local_138 -
               dVar17 / (dVar20 + dVar16 * *(double *)((long)local_128.first + 0x40) + in_XMM4._0_8_
                        );
      dVar18 = local_c8;
      if (dVar21 <= local_c8) {
        dVar18 = dVar21;
      }
      local_138 = (double *)
                  (-(ulong)(dVar21 < local_f8) & (ulong)local_f8 |
                  ~-(ulong)(dVar21 < local_f8) & (ulong)dVar18);
    }
    operator_delete((void *)local_128.first,
                    (long)local_128.second.
                          super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
                          m_data.array[1] - (long)local_128.first);
    bVar9 = lVar7 != 0;
    lVar7 = lVar7 + -1;
  } while ((auVar24 & (undefined1  [16])0x1) == (undefined1  [16])0x0 && bVar9);
  peVar2 = (this->m_curve).super___shared_ptr<anurbs::CurveBase<3L>,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var3 = (this->m_curve).super___shared_ptr<anurbs::CurveBase<3L>,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
  }
  (*peVar2->_vptr_CurveBase[5])(local_138._0_4_,&local_128);
  local_e8 = (double *)local_128.first;
  uStack_e0 = local_128.second.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
              m_storage.m_data.array[0];
  local_128.first = (double)local_88._0_8_;
  local_128.second.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
  array[0] = (double)local_88._8_8_;
  local_f8 = local_128.second.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage
             .m_data.array[1];
  local_128.second.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
  array[1] = local_78;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  local_c8 = (sample->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data
             .array[0];
  dStack_c0 = (sample->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.
              m_data.array[1];
  dVar15 = (sample->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
           array[2];
  peVar2 = (this->m_curve).super___shared_ptr<anurbs::CurveBase<3L>,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var3 = (this->m_curve).super___shared_ptr<anurbs::CurveBase<3L>,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
  }
  (*peVar2->_vptr_CurveBase[5])(SUB84(local_100,0),&local_128);
  dVar15 = dVar15 - local_f8;
  dVar15 = dVar15 * dVar15 +
           (dStack_c0 - uStack_e0) * (dStack_c0 - uStack_e0) +
           (local_c8 - (double)local_e8) * (local_c8 - (double)local_e8);
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  dVar18 = (sample->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
           array[0] - local_128.first;
  dVar21 = (sample->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
           array[1] -
           local_128.second.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
           m_data.array[0];
  dVar22 = (sample->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
           array[2] -
           local_128.second.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
           m_data.array[1];
  if (dVar15 <= dVar22 * dVar22 + dVar21 * dVar21 + dVar18 * dVar18) {
    peVar2 = (this->m_curve).super___shared_ptr<anurbs::CurveBase<3L>,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    p_Var3 = (this->m_curve).super___shared_ptr<anurbs::CurveBase<3L>,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      }
    }
    (*peVar2->_vptr_CurveBase[5])(local_d8,&local_b8);
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    dVar21 = (sample->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data
             .array[0] -
             local_b8.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
             array[0];
    dVar22 = (sample->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data
             .array[1] -
             local_b8.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
             array[1];
    dVar18 = (sample->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data
             .array[2] -
             local_b8.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
             array[2];
    dVar18 = dVar18 * dVar18 + dVar22 * dVar22 + dVar21 * dVar21;
    uVar10 = -(ulong)(dVar18 < dVar15);
    uVar11 = SUB84(local_b8.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
                   m_data.array[0],0);
    uVar12 = (int)((ulong)local_b8.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                          m_storage.m_data.array[0] >> 0x20);
    uVar13 = SUB84(local_b8.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
                   m_data.array[1],0);
    uVar14 = (int)((ulong)local_b8.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                          m_storage.m_data.array[1] >> 0x20);
    if (dVar15 <= dVar18) {
      uVar11 = (undefined4)local_e8;
      uVar12 = local_e8._4_4_;
      uVar13 = (undefined4)uStack_e0;
      uVar14 = uStack_e0._4_4_;
      local_b8.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
      [2] = local_f8;
    }
    this->m_parameter = (double)(~uVar10 & (ulong)local_138 | uVar10 & CONCAT44(uStack_d4,local_d8))
    ;
    *(undefined4 *)
     (this->m_point).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
     array = uVar11;
    *(undefined4 *)
     ((long)(this->m_point).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
            m_data.array + 4) = uVar12;
    *(undefined4 *)
     ((this->m_point).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
      array + 1) = uVar13;
    *(undefined4 *)
     ((long)(this->m_point).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
            m_data.array + 0xc) = uVar14;
    (this->m_point).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
    array[2] = local_b8.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
               m_data.array[2];
  }
  else {
    this->m_parameter = local_100;
    (this->m_point).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
    array[0] = local_128.first;
    (this->m_point).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
    array[1] = local_128.second.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
               m_storage.m_data.array[0];
    (this->m_point).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
    array[2] = local_128.second.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
               m_storage.m_data.array[1];
  }
  return;
}

Assistant:

void compute(const Vector& sample, const double max_distance = 0)
    {
        const auto domain = Curve()->domain();

        // closest point to polyline

        double closest_parameter = 0;
        Vector closest_point;

        double closest_sq_distance = Infinity;

        const auto& [ts, points] = m_tessellation;

        if (max_distance <= 0) {
            for (Index i = 1; i < length(ts); i++) {
                const auto t0 = ts[i - 1];
                const auto point0 = points[i - 1];
                const auto t1 = ts[i];
                const auto point1 = points[i];

                const auto [t, point] = project_to_line(sample, point0, point1, t0, t1);

                const Vector v = point - sample;

                const double sq_distance = squared_norm(v);

                if (sq_distance < closest_sq_distance) {
                    closest_sq_distance = sq_distance;
                    closest_parameter = t;
                    closest_point = point;
                }
            }
        } else {
            const auto [wa, idx_a, wb, idx_b] = mapper->map(sample, max_distance);

            closest_parameter = wa * ts[idx_a] + wb * ts[idx_b];
            closest_point = wa * points[idx_a] + wb * points[idx_b];
        }

        // newton-raphson

        const Index max_iter = 5;
        const double eps1 = tolerance();
        const double eps2 = tolerance() * 5;

        for (Index i = 0; i < max_iter; i++) {
            auto f = Curve()->derivatives_at(closest_parameter, 2);

            Vector dif = f[0] - sample;

            double c1v = norm(dif);

            double c2n = dot(f[1], dif);
            double c2d = norm(f[1]) * c1v;
            double c2v = c2d != 0 ? c2n / c2d : 0;

            bool c1 = c1v < eps1;
            bool c2 = std::abs(c2v) < eps2;

            if (c1 || c2) { // FIXME: check if 'or' is correct (NURBS Book P.231)
                break;
            }

            double delta = dot(f[1], dif) / (dot(f[2], dif) + squared_norm(f[1]));

            double nextParameter = closest_parameter - delta;

            // FIXME: out-of-domain check

            // FIXME: 3. condition: (nextParameter - closest_parameter) * f[1].norm();

            closest_parameter = domain.clamp(nextParameter);
        }

        closest_point = Curve()->point_at(closest_parameter);

        closest_sq_distance = squared_norm(Vector(sample - closest_point));

        Vector point_at_t0 = Curve()->point_at(domain.t0());

        if (squared_norm(Vector(sample - point_at_t0)) < closest_sq_distance) {
            m_parameter = domain.t0();
            m_point = point_at_t0;
            return;
        }

        Vector point_at_t1 = Curve()->point_at(domain.t1());

        if (squared_norm(Vector(sample - point_at_t1)) < closest_sq_distance) {
            m_parameter = domain.t1();
            m_point = point_at_t1;
            return;
        }

        m_parameter = closest_parameter;
        m_point = closest_point;
    }